

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessage<duckdb::SQLIdentifier,_duckdb::LogicalType>
                   (string *msg,SQLIdentifier *params,LogicalType *params_1)

{
  LogicalType *in_RCX;
  string *in_RDI;
  LogicalType *in_stack_00000010;
  SQLIdentifier *in_stack_00000018;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_00000020;
  string *in_stack_00000028;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  size_t num_args;
  LogicalType *in_stack_ffffffffffffff48;
  
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             0x2e055a4);
  SQLIdentifier::SQLIdentifier((SQLIdentifier *)in_RCX,(SQLIdentifier *)in_stack_ffffffffffffff48);
  LogicalType::LogicalType(in_RCX,in_stack_ffffffffffffff48);
  ConstructMessageRecursive<duckdb::SQLIdentifier,_duckdb::LogicalType>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  LogicalType::~LogicalType((LogicalType *)0x2e055fd);
  SQLIdentifier::~SQLIdentifier((SQLIdentifier *)0x2e05607);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          in_RDI);
  return in_RDI;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}